

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::InitializePrefetch
          (ColumnData *this,PrefetchState *prefetch_state,ColumnScanState *scan_state,
          idx_t remaining)

{
  ulong uVar1;
  ColumnScanState *extraout_RDX;
  ColumnScanState *pCVar2;
  ColumnScanState *extraout_RDX_00;
  idx_t iVar3;
  ColumnSegment *this_00;
  
  this_00 = scan_state->current;
  if (this_00 != (ColumnSegment *)0x0) {
    pCVar2 = scan_state;
    if (scan_state->initialized == false) {
      ColumnSegment::InitializePrefetch(this_00,prefetch_state,scan_state);
      pCVar2 = extraout_RDX;
    }
    iVar3 = scan_state->row_index;
    while (remaining != 0) {
      uVar1 = ((this_00->super_SegmentBase<duckdb::ColumnSegment>).start - iVar3) +
              (this_00->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i;
      if (remaining < uVar1) {
        uVar1 = remaining;
      }
      iVar3 = iVar3 + uVar1;
      remaining = remaining - uVar1;
      if (remaining != 0) {
        this_00 = (this_00->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
        if (this_00 == (ColumnSegment *)0x0) {
          return;
        }
        ColumnSegment::InitializePrefetch(this_00,prefetch_state,pCVar2);
        pCVar2 = extraout_RDX_00;
      }
    }
  }
  return;
}

Assistant:

void ColumnData::InitializePrefetch(PrefetchState &prefetch_state, ColumnScanState &scan_state, idx_t remaining) {
	auto current_segment = scan_state.current;
	if (!current_segment) {
		return;
	}
	if (!scan_state.initialized) {
		// need to prefetch for the current segment if we have not yet initialized the scan for this segment
		scan_state.current->InitializePrefetch(prefetch_state, scan_state);
	}
	idx_t row_index = scan_state.row_index;
	while (remaining > 0) {
		idx_t scan_count = MinValue<idx_t>(remaining, current_segment->start + current_segment->count - row_index);
		remaining -= scan_count;
		row_index += scan_count;
		if (remaining > 0) {
			auto next = data.GetNextSegment(current_segment);
			if (!next) {
				break;
			}
			next->InitializePrefetch(prefetch_state, scan_state);
			current_segment = next;
		}
	}
}